

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O1

void * mpp_buffer_get_ptr_with_caller(MppBuffer buffer,char *caller)

{
  undefined8 in_RAX;
  void *pvVar1;
  undefined4 uVar2;
  
  uVar2 = (undefined4)((ulong)in_RAX >> 0x20);
  if (buffer == (MppBuffer)0x0) {
    pvVar1 = (void *)0x0;
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_ptr invalid NULL input from %s\n",(char *)0x0,caller);
  }
  else {
    if (*(long *)((long)buffer + 0x90) == 0) {
      mpp_buffer_mmap((MppBufferImpl *)buffer,caller);
    }
    if (*(long *)((long)buffer + 0x90) == 0) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"p->info.ptr != __null"
                 ,"mpp_buffer_get_ptr_with_caller",CONCAT44(uVar2,0xb2));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    if (*(long *)((long)buffer + 0x90) == 0) {
      _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_ptr buffer %p ret NULL from %s\n",(char *)0x0,buffer
                 ,caller);
    }
    pvVar1 = *(void **)((long)buffer + 0x90);
  }
  return pvVar1;
}

Assistant:

void *mpp_buffer_get_ptr_with_caller(MppBuffer buffer, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_get_ptr invalid NULL input from %s\n", caller);
        return NULL;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    if (NULL == p->info.ptr)
        mpp_buffer_mmap(p, caller);

    mpp_assert(p->info.ptr != NULL);
    if (NULL == p->info.ptr)
        mpp_err("mpp_buffer_get_ptr buffer %p ret NULL from %s\n", buffer, caller);

    return p->info.ptr;
}